

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

Var __thiscall
Js::CrossSiteObject<Js::JavascriptArrayIterator>::GetHostDispatchVar
          (CrossSiteObject<Js::JavascriptArrayIterator> *this)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  Var hostDispatch;
  CrossSiteObject<Js::JavascriptArrayIterator> *this_local;
  
  pvVar3 = RecyclableObject::GetHostDispatchVar((RecyclableObject *)this);
  if (pvVar3 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSiteObject.h"
                                ,0xfc,"(hostDispatch)","hostDispatch");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pvVar3 = CrossSite::MarshalVar(scriptContext,pvVar3,false);
  return pvVar3;
}

Assistant:

Var CrossSiteObject<T>::GetHostDispatchVar()
    {
        Var hostDispatch = __super::GetHostDispatchVar();
        AssertMsg(hostDispatch, "hostDispatch");
        hostDispatch = CrossSite::MarshalVar(this->GetScriptContext(), hostDispatch);
        return hostDispatch;
    }